

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<int,_QByteArray>_>::rehash
          (Data<QHashPrivate::Node<int,_QByteArray>_> *this,size_t sizeHint)

{
  ulong uVar1;
  long lVar2;
  Node<int,_QByteArray> *this_00;
  ulong uVar3;
  size_t index;
  long lVar4;
  Node<int,_QByteArray> *key;
  long lVar5;
  size_t numBuckets;
  Span<QHashPrivate::Node<int,_QByteArray>_> *this_01;
  long in_FS_OFFSET;
  R_conflict8 RVar6;
  Bucket local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (sizeHint == 0) {
    sizeHint = *(size_t *)(this + 8);
  }
  numBuckets = 0x80;
  if (0x40 < sizeHint) {
    if (sizeHint >> 0x3e == 0) {
      lVar2 = 0x3f;
      if (sizeHint != 0) {
        for (; sizeHint >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      numBuckets = 1L << (0x41 - ((byte)lVar2 ^ 0x3f) & 0x3f);
    }
    else {
      numBuckets = 0xffffffffffffffff;
    }
  }
  uVar1 = *(ulong *)(this + 0x10);
  lVar2 = *(long *)(this + 0x20);
  RVar6 = allocateSpans(numBuckets);
  *(Span **)(this + 0x20) = RVar6.spans;
  *(size_t *)(this + 0x10) = numBuckets;
  lVar5 = lVar2;
  for (uVar3 = 0; uVar3 != uVar1 >> 7; uVar3 = uVar3 + 1) {
    this_01 = (Span<QHashPrivate::Node<int,_QByteArray>_> *)(uVar3 * 0x90 + lVar2);
    for (lVar4 = 0; lVar4 != 0x80; lVar4 = lVar4 + 1) {
      if (*(byte *)(lVar5 + lVar4) != 0xff) {
        key = (Node<int,_QByteArray> *)
              ((ulong)*(byte *)(lVar5 + lVar4) * 0x20 + *(long *)(this_01 + 0x80));
        local_48.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        local_48.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
        local_48 = findBucket<int>(this,(int *)key);
        this_00 = Bucket::insert(&local_48);
        Node<int,_QByteArray>::Node(this_00,key);
      }
    }
    Span<QHashPrivate::Node<int,_QByteArray>_>::freeData(this_01);
    lVar5 = lVar5 + 0x90;
  }
  if (lVar2 != 0) {
    lVar5 = *(long *)(lVar2 + -8);
    if (lVar5 != 0) {
      lVar4 = lVar5 * 0x90;
      do {
        Span<QHashPrivate::Node<int,_QByteArray>_>::freeData
                  ((Span<QHashPrivate::Node<int,_QByteArray>_> *)(lVar2 + -0x90 + lVar4));
        lVar4 = lVar4 + -0x90;
      } while (lVar4 != 0);
    }
    operator_delete__((void *)(lVar2 + -8),lVar5 * 0x90 | 8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }